

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::clearQueue(SessionState *this)

{
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_FIX::Message>,_std::_Select1st<std::pair<const_unsigned_long,_FIX::Message>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FIX::Message>_>_>
  ::clear(&(this->m_queue)._M_t);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void clearQueue() {
    Locker l(m_mutex);
    m_queue.clear();
  }